

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

sexp_conflict
sexp_getpwnam_r_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  int iVar1;
  passwd *__resultbuf;
  passwd **__result;
  sexp_conflict psVar2;
  sexp_conflict res1;
  sexp_conflict res4;
  sexp_conflict res;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &res1;
  res = (sexp_conflict)0x43e;
  res1 = (sexp_conflict)0x43e;
  res4 = (sexp_conflict)0x43e;
  psVar2 = arg0;
  if ((((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) && (psVar2 = arg2, ((ulong)arg2 & 3) == 0)) &&
     (arg2->tag == 9)) {
    local_60.var = &res;
    local_40.next = &local_60;
    local_60.next = (ctx->value).context.saves;
    local_50.next = &local_40;
    local_50.var = &res4;
    (ctx->value).context.saves = &local_50;
    __resultbuf = (passwd *)calloc(1,0x31);
    __result = (passwd **)calloc(1,9);
    iVar1 = getpwnam_r((((arg0->value).type.cpl)->value).flonum_bits +
                       (long)(((arg0->value).type.name)->value).flonum_bits,__resultbuf,
                       (((arg2->value).type.name)->value).flonum_bits + 8 +
                       (long)(arg2->value).type.cpl,(arg2->value).string.length,__result);
    if (iVar1 == 0) {
      res1 = (sexp_conflict)
             sexp_make_cpointer(ctx,(long)(self->value).type.print >> 1,__resultbuf,arg2,1);
      res4 = (sexp_conflict)
             sexp_make_cpointer(ctx,(((self->value).type.finalize_name)->value).uvector.length >> 1,
                                __result,0x3e,1);
      res = (sexp_conflict)0x23e;
      sexp_push_op(ctx,&res,res4);
      sexp_push_op(ctx,&res,res1);
    }
    else {
      res = (sexp_conflict)0x3e;
    }
    (ctx->value).context.saves = local_60.next;
    return res;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,9,psVar2);
  return psVar2;
}

Assistant:

sexp sexp_getpwnam_r_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  struct passwd* tmp1;
  struct passwd* *tmp4;
  sexp_gc_var3(res, res1, res4);
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg2))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg2);
  sexp_gc_preserve3(ctx, res, res1, res4);
  tmp1 = (struct passwd*) calloc(1, 1 + sizeof(tmp1[0]));
  tmp4 = (struct passwd**) calloc(1, 1 + sizeof(tmp4[0]));
  err = getpwnam_r(sexp_string_data(arg0), tmp1, sexp_string_data(arg2), sexp_string_size(arg2), tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, arg2, 1);
  res4 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ONE)), tmp4, SEXP_FALSE, 1);
  res = SEXP_NULL;
  sexp_push(ctx, res, res4);
  sexp_push(ctx, res, res1);
  }
  sexp_gc_release3(ctx);
  return res;
}